

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnImportTable
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index table_index,Type elem_type,Limits *elem_limits)

{
  Module *this_00;
  uint64_t uVar1;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_80;
  undefined1 local_78 [32];
  char *local_58;
  Location local_50;
  
  local_78._16_8_ = field_name._M_str;
  local_78._8_8_ = field_name._M_len;
  local_58 = module_name._M_str;
  local_78._24_8_ = module_name._M_len;
  std::make_unique<wabt::TableImport>();
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)(local_78._0_8_ + 8),
             (basic_string_view<char,_std::char_traits<char>_> *)(local_78 + 0x18));
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)(local_78._0_8_ + 0x28),
             (basic_string_view<char,_std::char_traits<char>_> *)(local_78 + 8));
  uVar1 = elem_limits->max;
  *(uint64_t *)(local_78._0_8_ + 0x70) = elem_limits->initial;
  *(uint64_t *)(local_78._0_8_ + 0x78) = uVar1;
  *(undefined4 *)(local_78._0_8_ + 0x7f) = *(undefined4 *)((long)&elem_limits->max + 7);
  *(Type *)(local_78._0_8_ + 0x88) = elem_type;
  this_00 = this->module_;
  GetLocation(&local_50,this);
  std::
  make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>>,wabt::Location>
            ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)&local_80,
             (Location *)local_78);
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&local_80);
  if (local_80._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
      0x0) {
    (**(code **)(*(long *)local_80._M_t.
                          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  local_80._M_t.
  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>.
  super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
       (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
       (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
       0x0;
  if ((long *)local_78._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_78._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportTable(Index import_index,
                                     std::string_view module_name,
                                     std::string_view field_name,
                                     Index table_index,
                                     Type elem_type,
                                     const Limits* elem_limits) {
  auto import = std::make_unique<TableImport>();
  import->module_name = module_name;
  import->field_name = field_name;
  import->table.elem_limits = *elem_limits;
  import->table.elem_type = elem_type;
  module_->AppendField(
      std::make_unique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}